

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O0

void __thiscall
agge::tests::GenericRGBXBlenderTests::AlphaIsMixedFromSrcAlphaAndCover
          (GenericRGBXBlenderTests *this)

{
  color color_;
  allocator local_121;
  string local_120 [32];
  LocationInfo local_100;
  allocator local_c1;
  string local_c0 [32];
  LocationInfo local_a0;
  undefined8 uStack_78;
  pixel reference2 [4];
  pixel reference1 [4];
  pixel dest2 [4];
  pixel dest1 [4];
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
  local_30;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba> b2;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba> b1;
  uint8_t covers [4];
  pixel back;
  int n;
  GenericRGBXBlenderTests *this_local;
  
  b1._a = 0x80e08020;
  b1._color.r = '\x10';
  b1._color.g = 0x90;
  b1._color.b = 0xa0;
  b1._color.a = 0xd0;
  b2._color = color::make(0x80,0x80,0x80,'0');
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  blender_solid_color_rgb
            ((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
              *)&b2._a,b2._color);
  color_ = color::make(0x80,0x80,0x80,0xc0);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  blender_solid_color_rgb(&local_30,color_);
  std::
  fill_n<agge::tests::mocks::pixel_rgbx<agge::order_rgba>*,int,agge::tests::mocks::pixel_rgbx<agge::order_rgba>>
            (dest2 + 2,4,(pixel_rgbx<agge::order_rgba> *)&b1._a);
  std::
  fill_n<agge::tests::mocks::pixel_rgbx<agge::order_rgba>*,int,agge::tests::mocks::pixel_rgbx<agge::order_rgba>>
            (reference1 + 2,4,(pixel_rgbx<agge::order_rgba> *)&b1._a);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
              *)&b2._a,dest2 + 2,0,0,4,(cover_type *)&b1);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&local_30,reference1 + 2,0,0,4,(cover_type *)&b1);
  reference2[2].components[0] = '!';
  reference2[2].components[1] = 0x80;
  reference2[2].components[2] = 0xde;
  reference2[2].components[3] = '\0';
  reference2[3].components[0] = '*';
  reference2[3].components[1] = 0x80;
  reference2[3].components[2] = 0xd5;
  reference2[3].components[3] = '\0';
  reference1[0].components[0] = '+';
  reference1[0].components[1] = 0x80;
  reference1[0].components[2] = 0xd4;
  reference1[0].components[3] = '\0';
  reference1[1].components[0] = '.';
  reference1[1].components[1] = 0x80;
  reference1[1].components[2] = 0xd1;
  reference1[1].components[3] = '\0';
  uStack_78._0_1_ = '$';
  uStack_78._1_1_ = 0x80;
  uStack_78._2_1_ = 0xdb;
  uStack_78._3_1_ = '\0';
  uStack_78._4_1_ = 'H';
  uStack_78._5_1_ = 0x80;
  uStack_78._6_1_ = 0xb7;
  uStack_78._7_1_ = '\0';
  reference2[0].components[0] = 'M';
  reference2[0].components[1] = 0x80;
  reference2[0].components[2] = 0xb2;
  reference2[0].components[3] = '\0';
  reference2[1].components[0] = 'Z';
  reference2[1].components[1] = 0x80;
  reference2[1].components[2] = 0xa5;
  reference2[1].components[3] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_c1);
  ut::LocationInfo::LocationInfo(&local_a0,(string *)local_c0,0xee);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,4ul>
            ((pixel_rgbx<agge::order_rgba> (*) [4])(reference2 + 2),
             (pixel_rgbx<agge::order_rgba> (*) [4])(dest2 + 2),&local_a0);
  ut::LocationInfo::~LocationInfo(&local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_121);
  ut::LocationInfo::LocationInfo(&local_100,(string *)local_120,0xef);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,4ul>
            ((pixel_rgbx<agge::order_rgba> (*) [4])&uStack_78,
             (pixel_rgbx<agge::order_rgba> (*) [4])(reference1 + 2),&local_100);
  ut::LocationInfo::~LocationInfo(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  return;
}

Assistant:

test( AlphaIsMixedFromSrcAlphaAndCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 4;
				const pixel back = { { 0x20, 0x80, 0xE0, 0x80 } };
				const uint8_t covers[n] = { 0x10, 0x90, 0xA0, 0xD0, };
				blender_solid_color_rgb<pixel, order_rgba> b1(color::make(0x80, 0x80, 0x80, 0x30));
				blender_solid_color_rgb<pixel, order_rgba> b2(color::make(0x80, 0x80, 0x80, 0xC0));
				pixel dest1[n];
				pixel dest2[n];

				fill_n(dest1, n, back);
				fill_n(dest2, n, back);

				// ACT
				b1(dest1, 0, 0, n, covers);
				b2(dest2, 0, 0, n, covers);

				// ASSERT
				pixel reference1[] = {
					{ { 0x21, 0x80, 0xDE, } },
					{ { 0x2A, 0x80, 0xD5, } },
					{ { 0x2B, 0x80, 0xD4, } },
					{ { 0x2E, 0x80, 0xD1, } },
				};
				pixel reference2[] = {
					{ { 0x24, 0x80, 0xDB, } },
					{ { 0x48, 0x80, 0xB7, } },
					{ { 0x4D, 0x80, 0xB2, } },
					{ { 0x5A, 0x80, 0xA5, } },
				};

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
			}